

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

uint64_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::NewId(ShardedLRUCache *this)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->id_mutex_);
  if (iVar1 == 0) {
    uVar2 = this->last_id_ + 1;
    this->last_id_ = uVar2;
    pthread_mutex_unlock((pthread_mutex_t *)&this->id_mutex_);
    return uVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

uint64_t NewId() override {
    MutexLock l(&id_mutex_);
    return ++(last_id_);
  }